

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferSource.hpp
# Opt level: O3

void __thiscall
Outputs::Speaker::SampleSource<GI::AY38910::AY38910<true>,_true,_4>::
apply_samples<(Outputs::Speaker::Action)0>
          (SampleSource<GI::AY38910::AY38910<true>,_true,_4> *this,size_t number_of_samples,
          type *target)

{
  AY38910SampleSource<true> *this_00;
  type *ptVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar13 [16];
  type level;
  type local_48;
  type local_44;
  type local_3c;
  
  this_00 = (AY38910SampleSource<true> *)(this + -0x454);
  GI::AY38910::AY38910SampleSource<true>::level(this_00);
  sVar9 = 0;
  if ((number_of_samples != 0) && (this->master_divider_ != 4)) {
    sVar9 = 0;
    do {
      target[sVar9] = local_48;
      sVar9 = sVar9 + 1;
      iVar5 = this->master_divider_ + 1;
      this->master_divider_ = iVar5;
      if (number_of_samples <= sVar9) break;
    } while (iVar5 != 4);
  }
  GI::AY38910::AY38910SampleSource<true>::advance(this_00);
  uVar8 = number_of_samples - sVar9;
  uVar7 = uVar8 >> 2;
  sVar10 = sVar9;
  if ((int)uVar7 != 0) {
    do {
      sVar9 = sVar10 + 4;
      GI::AY38910::AY38910SampleSource<true>::level(this_00);
      ptVar1 = target + sVar10;
      *ptVar1 = local_3c;
      ptVar1[1] = local_3c;
      ptVar1[2] = local_3c;
      ptVar1[3] = local_3c;
      GI::AY38910::AY38910SampleSource<true>::advance(this_00);
      uVar6 = (int)uVar7 - 1;
      uVar7 = (ulong)uVar6;
      sVar10 = sVar9;
    } while (uVar6 != 0);
    uVar8 = number_of_samples - sVar9;
  }
  GI::AY38910::AY38910SampleSource<true>::level(this_00);
  this->master_divider_ = (int)uVar8;
  GI::AY38910::AY38910SampleSource<true>::level(this_00);
  auVar4 = _DAT_00463a50;
  auVar3 = _DAT_00463a40;
  auVar2 = _DAT_00463a30;
  if (sVar9 != number_of_samples) {
    uVar8 = (number_of_samples * 4 + sVar9 * -4) - 4;
    auVar13._8_4_ = (int)uVar8;
    auVar13._0_8_ = uVar8;
    auVar13._12_4_ = (int)(uVar8 >> 0x20);
    auVar11._0_8_ = uVar8 >> 2;
    auVar11._8_8_ = auVar13._8_8_ >> 2;
    uVar7 = 0;
    auVar11 = auVar11 ^ _DAT_00463a50;
    do {
      auVar12._8_4_ = (int)uVar7;
      auVar12._0_8_ = uVar7;
      auVar12._12_4_ = (int)(uVar7 >> 0x20);
      auVar13 = (auVar12 | auVar3) ^ auVar4;
      iVar5 = auVar11._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar5 && auVar11._0_4_ < auVar13._0_4_ || iVar5 < auVar13._4_4_)
                & 1)) {
        target[sVar9 + uVar7] = local_44;
      }
      if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
          auVar13._12_4_ <= auVar11._12_4_) {
        target[sVar9 + uVar7 + 1] = local_44;
      }
      auVar13 = (auVar12 | auVar2) ^ auVar4;
      iVar14 = auVar13._4_4_;
      if (iVar14 <= iVar5 && (iVar14 != iVar5 || auVar13._0_4_ <= auVar11._0_4_)) {
        target[sVar9 + uVar7 + 2] = local_44;
        target[sVar9 + uVar7 + 3] = local_44;
      }
      uVar7 = uVar7 + 4;
    } while (((uVar8 >> 2) + 4 & 0xfffffffffffffffc) != uVar7);
  }
  return;
}

Assistant:

void apply_samples(std::size_t number_of_samples, typename SampleT<stereo>::type *target) {
			auto &source = *static_cast<SourceT *>(this);

			if constexpr (divider == 1) {
				while(number_of_samples--) {
					apply<action>(*target, source.level());
					++target;
					source.advance();
				}
			} else {
				std::size_t c = 0;

				// Fill in the tail of any partially-captured level.
				auto level = source.level();
				while(c < number_of_samples && master_divider_ != divider) {
					apply<action>(target[c], level);
					++c;
					++master_divider_;
				}
				source.advance();

				// Provide all full levels.
				auto whole_steps = static_cast<int>((number_of_samples - c) / divider);
				while(whole_steps--) {
					fill<action>(&target[c], &target[c + divider], source.level());
					c += divider;
					source.advance();
				}

				// Provide the head of a further partial capture.
				level = source.level();
				master_divider_ = static_cast<int>(number_of_samples - c);
				fill<action>(&target[c], &target[number_of_samples], source.level());
			}
		}